

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O2

void amrex::MultiFab::Xpay
               (MultiFab *dst,Real a,MultiFab *src,int srccomp,int dstcomp,int numcomp,
               IntVect *nghost)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  Box local_1a4;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  FabArray<amrex::FArrayBox> *local_168;
  Real local_160;
  FabArray<amrex::FArrayBox> *local_158;
  IntVect *local_150;
  ulong local_148;
  long local_140;
  long local_138;
  long local_130;
  ulong local_128;
  long local_120;
  long local_118;
  Array4<double> dfab;
  Array4<const_double> sfab;
  MFIter mfi;
  
  uVar1 = (ulong)(uint)numcomp;
  local_168 = &dst->super_FabArray<amrex::FArrayBox>;
  local_160 = a;
  local_158 = &src->super_FabArray<amrex::FArrayBox>;
  local_150 = nghost;
  MFIter::MFIter(&mfi,(FabArrayBase *)dst,true);
  if (numcomp < 1) {
    uVar1 = 0;
  }
  local_178 = (long)srccomp << 3;
  local_170 = (long)dstcomp << 3;
  local_148 = uVar1;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox(&local_1a4,&mfi,local_150);
    if ((((local_1a4.smallend.vect[0] <= local_1a4.bigend.vect[0]) &&
         (local_1a4.smallend.vect[1] <= local_1a4.bigend.vect[1])) &&
        (local_1a4.smallend.vect[2] <= local_1a4.bigend.vect[2])) && (local_1a4.btype.itype < 8)) {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&sfab,local_158,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&dfab,local_168,&mfi);
      local_130 = (long)local_1a4.smallend.vect[1];
      local_140 = (long)local_1a4.smallend.vect[2];
      local_138 = (long)local_1a4.smallend.vect[0] * 8;
      local_180 = local_170;
      local_188 = local_178;
      for (local_128 = 0; lVar4 = local_140, local_128 != local_148; local_128 = local_128 + 1) {
        for (; (int)lVar4 <= local_1a4.bigend.vect[2]; lVar4 = lVar4 + 1) {
          local_118 = (long)dfab.begin.x;
          local_120 = (long)dfab.begin.y;
          lVar6 = (long)sfab.p +
                  sfab.nstride * local_188 +
                  (local_130 - sfab.begin.y) * sfab.jstride * 8 +
                  (lVar4 - sfab.begin.z) * sfab.kstride * 8 + (long)sfab.begin.x * -8 + local_138;
          lVar2 = (long)dfab.p +
                  dfab.nstride * local_180 +
                  (local_130 - local_120) * dfab.jstride * 8 +
                  (lVar4 - dfab.begin.z) * dfab.kstride * 8 + local_118 * -8 + local_138;
          for (lVar5 = local_130; lVar5 <= local_1a4.bigend.vect[1]; lVar5 = lVar5 + 1) {
            if (local_1a4.smallend.vect[0] <= local_1a4.bigend.vect[0]) {
              lVar3 = 0;
              do {
                *(double *)(lVar2 + lVar3 * 8) =
                     *(double *)(lVar2 + lVar3 * 8) * local_160 + *(double *)(lVar6 + lVar3 * 8);
                lVar3 = lVar3 + 1;
              } while ((local_1a4.bigend.vect[0] - local_1a4.smallend.vect[0]) + 1 != (int)lVar3);
            }
            lVar6 = lVar6 + sfab.jstride * 8;
            lVar2 = lVar2 + dfab.jstride * 8;
          }
        }
        local_188 = local_188 + 8;
        local_180 = local_180 + 8;
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
MultiFab::Xpay (MultiFab& dst, Real a, const MultiFab& src,
                int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
    BL_ASSERT(dst.boxArray() == src.boxArray());
    BL_ASSERT(dst.distributionMap == src.distributionMap);
    BL_ASSERT(dst.nGrowVect().allGE(nghost) && src.nGrowVect().allGE(nghost));

    BL_PROFILE("MultiFab::Xpay()");

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstma = dst.arrays();
        auto const& srcma = src.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstma[box_no](i,j,k,n+dstcomp) = srcma[box_no](i,j,k,n+srccomp)
                +                        a * dstma[box_no](i,j,k,n+dstcomp);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok()) {
                auto const sfab = src.array(mfi);
                auto       dfab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dfab(i,j,k,n+dstcomp) = sfab(i,j,k,n+srccomp) + a * dfab(i,j,k,n+dstcomp);
                });
            }
        }
    }
}